

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O2

int IDAApolynomialStorePnt(IDAMem IDA_mem,IDAdtpntMem d)

{
  uint uVar1;
  IDAadjMemRec *pIVar2;
  undefined8 *puVar3;
  sunrealtype *psVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  pIVar2 = IDA_mem->ida_adj_mem;
  puVar3 = (undefined8 *)d->content;
  N_VScale(0x3ff0000000000000,IDA_mem->ida_phi[0],*puVar3);
  if ((N_Vector)puVar3[2] != (N_Vector)0x0) {
    IDAAGettnSolutionYp(IDA_mem,(N_Vector)puVar3[2]);
  }
  if (pIVar2->ia_storeSensi != 0) {
    uVar1 = IDA_mem->ida_Ns;
    uVar6 = 0;
    uVar7 = 0;
    if (0 < (int)uVar1) {
      uVar7 = (ulong)uVar1;
    }
    psVar4 = IDA_mem->ida_cvals;
    for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      psVar4[uVar6] = 1.0;
    }
    iVar5 = N_VScaleVectorArray(uVar1,psVar4,IDA_mem->ida_phiS[0],puVar3[1]);
    if (iVar5 != 0) {
      return -0x1c;
    }
    if ((N_Vector *)puVar3[3] != (N_Vector *)0x0) {
      IDAAGettnSolutionYpS(IDA_mem,(N_Vector *)puVar3[3]);
    }
  }
  *(int *)(puVar3 + 4) = IDA_mem->ida_kused;
  return 0;
}

Assistant:

static int IDAApolynomialStorePnt(IDAMem IDA_mem, IDAdtpntMem d)
{
  IDAadjMem IDAADJ_mem;
  IDApolynomialDataMem content;
  int is, retval;

  IDAADJ_mem = IDA_mem->ida_adj_mem;
  content    = (IDApolynomialDataMem)d->content;

  N_VScale(ONE, IDA_mem->ida_phi[0], content->y);

  /* copy also the derivative for the first data point (in this case
     content->yp is non-null). */
  if (content->yd) { IDAAGettnSolutionYp(IDA_mem, content->yd); }

  if (IDAADJ_mem->ia_storeSensi)
  {
    for (is = 0; is < IDA_mem->ida_Ns; is++) { IDA_mem->ida_cvals[is] = ONE; }

    retval = N_VScaleVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_cvals,
                                 IDA_mem->ida_phiS[0], content->yS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

    /* store the derivative if it is the first data point. */
    if (content->ySd) { IDAAGettnSolutionYpS(IDA_mem, content->ySd); }
  }

  content->order = IDA_mem->ida_kused;

  return (0);
}